

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_list.cpp
# Opt level: O0

string * __thiscall
libtorrent::aux::tracker_list::last_working_url_abi_cxx11_
          (string *__return_storage_ptr__,tracker_list *this)

{
  tracker_list *this_local;
  
  if (this->m_last_working_tracker == (announce_entry *)0x0) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&this->m_last_working_tracker->url);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string tracker_list::last_working_url() const
{
	if (m_last_working_tracker == nullptr) return {};
	return m_last_working_tracker->url;
}